

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

void apx_client_unregister_event_listener(apx_client_t *self,void *handle)

{
  _Bool _Var1;
  
  if (handle != (void *)0x0 && self != (apx_client_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&self->event_listener_lock);
    _Var1 = adt_list_remove(self->event_listeners,handle);
    pthread_mutex_unlock((pthread_mutex_t *)&self->event_listener_lock);
    if (_Var1) {
      apx_clientEventListener_vdelete(handle);
      return;
    }
  }
  return;
}

Assistant:

void apx_client_unregister_event_listener(apx_client_t *self, void *handle)
{
   if ( (self != NULL) && (handle != 0) )
   {
      bool deleteSuccess = false;
      MUTEX_LOCK(self->event_listener_lock);
      deleteSuccess = adt_list_remove(self->event_listeners, handle);
      MUTEX_UNLOCK(self->event_listener_lock);
      if (deleteSuccess)
      {
         apx_clientEventListener_vdelete(handle);
      }
   }
}